

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsTime helicsInputLastUpdateTime(HelicsInput inp)

{
  HelicsInput pvVar1;
  Time TVar2;
  HelicsTime HVar3;
  
  pvVar1 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar1 = inp;
  }
  if (pvVar1 == (HelicsInput)0x0) {
    HVar3 = -1.785e+39;
  }
  else {
    TVar2 = helics::Input::getLastUpdate(*(Input **)((long)pvVar1 + 0x18));
    HVar3 = (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
            (double)(TVar2.internalTimeCode / 1000000000);
  }
  return HVar3;
}

Assistant:

HelicsTime helicsInputLastUpdateTime(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getLastUpdate();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}